

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeCommandListAppendWriteGlobalTimestamp
          (ze_command_list_handle_t hCommandList,uint64_t *dstptr,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  _func_void__ze_command_list_append_write_global_timestamp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_command_list_handle_t_ptr_unsigned_long_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  ulong *puVar5;
  uint in_ECX;
  _ze_event_handle_t *in_RDX;
  long lVar6;
  unsigned_long *in_RSI;
  _ze_command_list_handle_t *in_RDI;
  _ze_event_handle_t **in_R8;
  ulong uVar7;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_command_list_append_write_global_timestamp_params_t tracerParams;
  uint local_10c;
  _ze_event_handle_t **local_108;
  _ze_event_handle_t *local_100;
  unsigned_long *local_f8;
  _ze_command_list_handle_t *local_f0;
  _func_void__ze_command_list_append_write_global_timestamp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_e8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_e0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_c8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_78;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_68;
  _ze_command_list_append_write_global_timestamp_params_t local_58;
  
  if (DAT_0017f368 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr_unsigned_long_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_10c = in_ECX;
    local_108 = in_R8;
    local_100 = in_RDX;
    local_f8 = in_RSI;
    local_f0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar4 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_0017f368)(local_f0,local_f8,local_100,local_10c,local_108);
      return _Var2;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar4 = '\x01';
    local_58.phCommandList = &local_f0;
    local_58.pdstptr = &local_f8;
    local_58.phSignalEvent = &local_100;
    local_58.pnumWaitEvents = &local_10c;
    local_58.pphWaitEvents = &local_108;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_e8 = (_func_void__ze_command_list_append_write_global_timestamp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar5 != (ulong *)0x0) && (*puVar5 != 0)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_68.current_api_callback =
             *(_func_void__ze_command_list_append_write_global_timestamp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)(puVar5[1] + 0x238 + lVar6);
        p_Var1 = *(_func_void__ze_command_list_append_write_global_timestamp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar5[1] + 0x890 + lVar6);
        local_68.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        if (vStack_e0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_e0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_e0,
                     (iterator)
                     vStack_e0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          (vStack_e0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_68.current_api_callback;
          (vStack_e0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_68.pUserData;
          vStack_e0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_e0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_78.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        local_78.current_api_callback = p_Var1;
        if (local_c8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          (local_c8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_c8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_78.pUserData;
          local_c8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0xcb8;
      } while (uVar7 < *puVar5);
    }
    p_Var1 = local_e8;
    zeApiPtr = DAT_0017f368;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_90,&vStack_e0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_a8,&local_c8);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,unsigned_long*,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_write_global_timestamp_params_t*,void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_write_global_timestamp_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,unsigned_long*&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                      (zeApiPtr,&local_58,p_Var1,&local_90,&local_a8,local_58.phCommandList,
                       local_58.pdstptr,local_58.phSignalEvent,local_58.pnumWaitEvents,
                       local_58.pphWaitEvents);
    if (local_a8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_e0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_e0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_e0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_e0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_write_global_timestamp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendWriteGlobalTimestamp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint64_t* dstptr,                               ///< [in,out] pointer to memory where timestamp value will be written; must
                                                        ///< be 8byte-aligned.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing query;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing query
        )
    {
        auto pfnAppendWriteGlobalTimestamp = context.zeDdiTable.CommandList.pfnAppendWriteGlobalTimestamp;

        if( nullptr == pfnAppendWriteGlobalTimestamp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendWriteGlobalTimestamp, hCommandList, dstptr, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_write_global_timestamp_params_t tracerParams = {
            &hCommandList,
            &dstptr,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendWriteGlobalTimestampCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendWriteGlobalTimestampCb_t, CommandList, pfnAppendWriteGlobalTimestampCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendWriteGlobalTimestamp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pdstptr,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }